

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::UnpackUnorm4x8Case::UnpackUnorm4x8Case
          (UnpackUnorm4x8Case *this,TestContext *testCtx,ShaderType shaderType)

{
  allocator<char> local_89;
  VarType local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Symbol local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"unpackunorm4x8",(allocator<char> *)&local_88);
  std::operator+(&local_50.name,&local_70,
                 *(char **)(shaderexecutor::(anonymous_namespace)::
                            getShaderTypePostfix(glu::ShaderType)::s_postfix + (ulong)shaderType * 8
                           ));
  ShaderPackingFunctionCase::ShaderPackingFunctionCase
            (&this->super_ShaderPackingFunctionCase,testCtx,local_50.name._M_dataplus._M_p,
             "unpackUnorm4x8",shaderType);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ShaderPackingFunctionCase_00be0e80;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"in0",&local_89);
  glu::VarType::VarType(&local_88,TYPE_UINT,PRECISION_HIGHP);
  Symbol::Symbol(&local_50,&local_70,&local_88);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>
            (&(this->super_ShaderPackingFunctionCase).m_spec.inputs,&local_50);
  Symbol::~Symbol(&local_50);
  glu::VarType::~VarType(&local_88);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out0",&local_89);
  glu::VarType::VarType(&local_88,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  Symbol::Symbol(&local_50,&local_70,&local_88);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>
            (&(this->super_ShaderPackingFunctionCase).m_spec.outputs,&local_50);
  Symbol::~Symbol(&local_50);
  glu::VarType::~VarType(&local_88);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::assign((char *)&(this->super_ShaderPackingFunctionCase).m_spec.source);
  return;
}

Assistant:

UnpackUnorm4x8Case (tcu::TestContext& testCtx, glu::ShaderType shaderType)
		: ShaderPackingFunctionCase	(testCtx, (string("unpackunorm4x8") + getShaderTypePostfix(shaderType)).c_str(), "unpackUnorm4x8", shaderType)
	{
		m_spec.inputs.push_back(Symbol("in0", glu::VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP)));

		m_spec.source = "out0 = unpackUnorm4x8(in0);";
	}